

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeInitPage(MemPage *pPage)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  uint uVar5;
  BtShared *pBVar6;
  u8 *puVar7;
  u16 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  
  pBVar6 = pPage->pBt;
  puVar7 = pPage->aData;
  bVar1 = pPage->hdrOffset;
  iVar9 = decodeFlags(pPage,(uint)puVar7[bVar1]);
  if (iVar9 != 0) {
    uVar12 = 0xefbe;
    goto LAB_0012cb15;
  }
  uVar4 = pBVar6->pageSize;
  pPage->maskPage = (short)uVar4 - 1;
  pPage->nOverflow = '\0';
  uVar5 = pBVar6->usableSize;
  bVar2 = pPage->childPtrSize;
  uVar10 = bVar1 + 8 + (uint)bVar2;
  pPage->cellOffset = (u16)uVar10;
  pPage->aDataEnd = puVar7 + (int)uVar5;
  pPage->aCellIdx = puVar7 + (ulong)((uint)bVar1 + (uint)bVar2) + 8;
  pPage->aDataOfst = puVar7 + bVar2;
  bVar2 = puVar7[(ulong)bVar1 + 5];
  uVar13 = *(ushort *)(puVar7 + (ulong)bVar1 + 3) << 8 | *(ushort *)(puVar7 + (ulong)bVar1 + 3) >> 8
  ;
  bVar3 = puVar7[(ulong)bVar1 + 6];
  pPage->nCell = uVar13;
  if ((uVar4 - 8) / 6 < (uint)uVar13) {
    uVar12 = 0xefd1;
    goto LAB_0012cb15;
  }
  uVar11 = uVar10 + (uint)uVar13 * 2;
  iVar9 = uVar5 - 4;
  if ((pBVar6->db->flags & 0x100000) != 0) {
    if (pPage->leaf == '\0') {
      iVar9 = uVar5 - 5;
    }
    bVar18 = pPage->nCell != 0;
    if (bVar18) {
      uVar17 = 0;
      do {
        uVar13 = *(ushort *)(puVar7 + uVar17 * 2 + (ulong)uVar10) << 8 |
                 *(ushort *)(puVar7 + uVar17 * 2 + (ulong)uVar10) >> 8;
        if ((uVar13 < uVar11) || (iVar9 < (int)(uint)uVar13)) {
          uVar12 = 0xefed;
LAB_0012ca10:
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          goto LAB_0012ca1a;
        }
        uVar8 = (*pPage->xCellSize)(pPage,puVar7 + (uint)uVar13);
        if ((int)uVar5 < (int)((uint)uVar8 + (uint)uVar13)) {
          uVar12 = 0xeff2;
          goto LAB_0012ca10;
        }
        uVar17 = uVar17 + 1;
        bVar18 = uVar17 < pPage->nCell;
      } while (bVar18);
    }
    iVar9 = iVar9 + (uint)(pPage->leaf == '\0');
LAB_0012ca1a:
    if (bVar18) {
      return 0xb;
    }
  }
  uVar13 = *(ushort *)(puVar7 + (ulong)bVar1 + 1) << 8 | *(ushort *)(puVar7 + (ulong)bVar1 + 1) >> 8
  ;
  iVar16 = (uint)puVar7[(ulong)bVar1 + 7] + (((uint)bVar2 * 0x100 + (uint)bVar3) - 1 & 0xffff) + 1;
  if (uVar13 != 0) {
    uVar12 = 0xf004;
    uVar10 = (uint)uVar13;
    if (uVar13 < uVar11) {
LAB_0012cabe:
      bVar18 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
    }
    else {
      do {
        uVar15 = uVar10;
        if (iVar9 < (int)uVar15) {
          uVar12 = 0xf009;
          goto LAB_0012cabe;
        }
        uVar14 = *(ushort *)(puVar7 + uVar15) << 8 | *(ushort *)(puVar7 + uVar15) >> 8;
        uVar13 = *(ushort *)(puVar7 + (ulong)uVar15 + 2) << 8 |
                 *(ushort *)(puVar7 + (ulong)uVar15 + 2) >> 8;
        iVar16 = iVar16 + (uint)uVar13;
        uVar10 = (uint)uVar14;
      } while (uVar13 + uVar15 + 3 < (uint)uVar14);
      uVar12 = 0xf013;
      if (uVar14 != 0) goto LAB_0012cabe;
      bVar18 = true;
      uVar12 = 0xf017;
      if (uVar5 < uVar13 + uVar15) goto LAB_0012cabe;
    }
    if (!bVar18) {
      return 0xb;
    }
  }
  if (iVar16 <= (int)uVar5) {
    pPage->nFree = (short)iVar16 - (short)uVar11;
    pPage->isInit = '\x01';
    return 0;
  }
  uVar12 = 0xf023;
LAB_0012cb15:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
              "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  return 0xb;
}

Assistant:

static int btreeInitPage(MemPage *pPage){
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 hdr;            /* Offset to beginning of page header */
  u8 *data;          /* Equal to pPage->aData */
  BtShared *pBt;        /* The main btree structure */
  int usableSize;    /* Amount of usable space on each page */
  u16 cellOffset;    /* Offset from start of page to first cell pointer */
  int nFree;         /* Number of unused bytes on the page */
  int top;           /* First byte of the cell content area */
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==0 );

  pBt = pPage->pBt;
  hdr = pPage->hdrOffset;
  data = pPage->aData;
  /* EVIDENCE-OF: R-28594-02890 The one-byte flag at offset 0 indicating
  ** the b-tree page type. */
  if( decodeFlags(pPage, data[hdr]) ){
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nOverflow = 0;
  usableSize = pBt->usableSize;
  pPage->cellOffset = cellOffset = hdr + 8 + pPage->childPtrSize;
  pPage->aDataEnd = &data[usableSize];
  pPage->aCellIdx = &data[cellOffset];
  pPage->aDataOfst = &data[pPage->childPtrSize];
  /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
  ** the start of the cell content area. A zero value for this integer is
  ** interpreted as 65536. */
  top = get2byteNotZero(&data[hdr+5]);
  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  pPage->nCell = get2byte(&data[hdr+3]);
  if( pPage->nCell>MX_CELL(pBt) ){
    /* To many cells for a single page.  The page must be corrupt */
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  testcase( pPage->nCell==MX_CELL(pBt) );
  /* EVIDENCE-OF: R-24089-57979 If a page contains no cells (which is only
  ** possible for a root page of a table that contains no rows) then the
  ** offset to the cell content area will equal the page size minus the
  ** bytes of reserved space. */
  assert( pPage->nCell>0 || top==usableSize || CORRUPT_DB );

  /* A malformed database page might cause us to read past the end
  ** of page when parsing a cell.  
  **
  ** The following block of code checks early to see if a cell extends
  ** past the end of a page boundary and causes SQLITE_CORRUPT to be 
  ** returned if it does.
  */
  iCellFirst = cellOffset + 2*pPage->nCell;
  iCellLast = usableSize - 4;
  if( pBt->db->flags & SQLITE_CellSizeCk ){
    int i;            /* Index into the cell pointer array */
    int sz;           /* Size of a cell */

    if( !pPage->leaf ) iCellLast--;
    for(i=0; i<pPage->nCell; i++){
      pc = get2byteAligned(&data[cellOffset+i*2]);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      if( pc<iCellFirst || pc>iCellLast ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      sz = pPage->xCellSize(pPage, &data[pc]);
      testcase( pc+sz==usableSize );
      if( pc+sz>usableSize ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
    }
    if( !pPage->leaf ) iCellLast++;
  }  

  /* Compute the total free space on the page
  ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
  ** start of the first freeblock on the page, or is zero if there are no
  ** freeblocks. */
  pc = get2byte(&data[hdr+1]);
  nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
  if( pc>0 ){
    u32 next, size;
    if( pc<iCellFirst ){
      /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
      ** always be at least one cell before the first freeblock.
      */
      return SQLITE_CORRUPT_PGNO(pPage->pgno); 
    }
    while( 1 ){
      if( pc>iCellLast ){
        /* Freeblock off the end of the page */
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      next = get2byte(&data[pc]);
      size = get2byte(&data[pc+2]);
      nFree = nFree + size;
      if( next<=pc+size+3 ) break;
      pc = next;
    }
    if( next>0 ){
      /* Freeblock not in ascending order */
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
    if( pc+size>(unsigned int)usableSize ){
      /* Last freeblock extends past page end */
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
  }

  /* At this point, nFree contains the sum of the offset to the start
  ** of the cell-content area plus the number of free bytes within
  ** the cell-content area. If this is greater than the usable-size
  ** of the page, then the page must be corrupted. This check also
  ** serves to verify that the offset to the start of the cell-content
  ** area, according to the page header, lies within the page.
  */
  if( nFree>usableSize ){
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  pPage->nFree = (u16)(nFree - iCellFirst);
  pPage->isInit = 1;
  return SQLITE_OK;
}